

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_wav_init_internal(ma_decoding_backend_config *pConfig,ma_wav *pWav)

{
  ma_format mVar1;
  ma_result mVar2;
  ma_data_source_base *pDataSourceBase;
  
  if (pWav == (ma_wav *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar2 = MA_SUCCESS;
    memset(pWav,0,0x200);
    if (((pConfig != (ma_decoding_backend_config *)0x0) &&
        (mVar1 = pConfig->preferredFormat, mVar1 < ma_format_count)) &&
       ((0x34U >> (mVar1 & 0x1f) & 1) != 0)) {
      pWav->format = mVar1;
    }
    (pWav->ds).vtable = (ma_data_source_vtable *)0x0;
    (pWav->ds).rangeBegInFrames = 0;
    (pWav->ds).rangeEndInFrames = 0;
    (pWav->ds).loopBegInFrames = 0;
    (pWav->ds).loopEndInFrames = 0;
    (pWav->ds).pCurrent = (ma_data_source *)0x0;
    (pWav->ds).pNext = (ma_data_source *)0x0;
    (pWav->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pWav->ds).isLooping = 0;
    (pWav->ds).vtable = &g_ma_wav_ds_vtable;
    (pWav->ds).rangeBegInFrames = 0;
    (pWav->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pWav->ds).loopBegInFrames = 0;
    (pWav->ds).loopEndInFrames = 0xffffffffffffffff;
    (pWav->ds).pCurrent = pWav;
  }
  return mVar2;
}

Assistant:

static ma_result ma_wav_init_internal(const ma_decoding_backend_config* pConfig, ma_wav* pWav)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pWav);
    pWav->format = ma_format_unknown;   /* Use closest match to source file by default. */

    if (pConfig != NULL && (pConfig->preferredFormat == ma_format_f32 || pConfig->preferredFormat == ma_format_s16 || pConfig->preferredFormat == ma_format_s32)) {
        pWav->format = pConfig->preferredFormat;
    } else {
        /* Getting here means something other than f32 and s16 was specified. Just leave this unset to use the default format. */
    }

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_wav_ds_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pWav->ds);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the base data source. */
    }

    return MA_SUCCESS;
}